

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc_wrapper.cpp
# Opt level: O2

size_t duckdb::Utf8Proc::NextGraphemeCluster(char *s,size_t len,size_t cpos)

{
  utf8proc_bool uVar1;
  uint in_EAX;
  int32_t c1;
  int32_t c2;
  int sz;
  utf8proc_int32_t state;
  undefined8 local_38;
  
  local_38._0_4_ = in_EAX;
  c1 = UTF8ToCodepoint(s + cpos,(int *)&local_38);
  local_38 = (ulong)(uint)local_38;
  do {
    cpos = (long)(int)(uint)local_38 + cpos;
    if (len <= cpos) {
      return cpos;
    }
    c2 = UTF8ToCodepoint(s + cpos,(int *)&local_38);
    uVar1 = utf8proc_grapheme_break_stateful(c1,c2,(utf8proc_int32_t *)((long)&local_38 + 4));
    c1 = c2;
  } while (!uVar1);
  return cpos;
}

Assistant:

size_t Utf8Proc::NextGraphemeCluster(const char *s, size_t len, size_t cpos) {
	int sz;
	auto prev_codepoint = Utf8Proc::UTF8ToCodepoint(s + cpos, sz);
	utf8proc_int32_t state = 0;
	while (true) {
		cpos += sz;
		if (cpos >= len) {
			return cpos;
		}
		auto next_codepoint = Utf8Proc::UTF8ToCodepoint(s + cpos, sz);
		if (utf8proc_grapheme_break_stateful(prev_codepoint, next_codepoint, &state)) {
			// found a grapheme break here
			return cpos;
		}
		// not a grapheme break, move on to next codepoint
		prev_codepoint = next_codepoint;
	}
}